

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauden.c
# Opt level: O3

void gauden_compute_norm(gauden_t *g)

{
  uint uVar1;
  float32 ***pppfVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  float32 fVar9;
  
  if (g->norm != (float32 ***)0x0) {
    ckd_free_3d(g->norm);
  }
  pppfVar2 = (float32 ***)
             __ckd_calloc_3d__((ulong)g->n_mgau,(ulong)g->n_feat,(ulong)g->n_density,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libmodinv/gauden.c"
                               ,0x179);
  g->norm = pppfVar2;
  uVar3 = g->n_mgau;
  if (uVar3 != 0) {
    uVar1 = g->n_feat;
    uVar7 = 0;
    uVar5 = uVar1;
    do {
      if (uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        uVar4 = (ulong)g->n_density;
        uVar8 = 0;
        do {
          if ((int)uVar4 == 0) {
            uVar4 = 0;
          }
          else {
            uVar6 = 0;
            do {
              if (g->fullvar == (vector_t ****)0x0) {
                fVar9 = diag_norm(g->var[uVar7][uVar8][uVar6],g->veclen[uVar8]);
              }
              else {
                fVar9 = full_norm(g->fullvar[uVar7][uVar8][uVar6],g->veclen[uVar8]);
              }
              g->norm[uVar7][uVar8][uVar6] = fVar9;
              uVar6 = uVar6 + 1;
              uVar4 = (ulong)g->n_density;
            } while (uVar6 < uVar4);
            uVar1 = g->n_feat;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < uVar1);
        uVar3 = g->n_mgau;
        uVar5 = uVar1;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar3);
  }
  return;
}

Assistant:

void
gauden_compute_norm(gauden_t *g)
{
    uint32 i, j, k;

    if (g->norm) {
	ckd_free_3d((void ***)g->norm);
    }

    g->norm  = (float32 ***) ckd_calloc_3d(g->n_mgau, g->n_feat, g->n_density,
					  sizeof(float32));

    for (i = 0; i < g->n_mgau; i++) {
	for (j = 0; j < g->n_feat; j++) {
	    for (k = 0; k < g->n_density; k++) {
		if (g->fullvar)
		    g->norm[i][j][k] = full_norm(g->fullvar[i][j][k], g->veclen[j]);
		else
		    g->norm[i][j][k] = diag_norm(g->var[i][j][k], g->veclen[j]);
	    }
	}
    }
}